

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lutf8lib.c
# Opt level: O3

char * utf8_decode(char *s,utfint *val,int strict)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  
  bVar1 = *s;
  uVar5 = (uint)bVar1;
  if ((char)bVar1 < '\0') {
    uVar5 = 0;
    if ((bVar1 & 0x40) == 0) {
      uVar3 = (uint)bVar1;
      uVar6 = 0;
    }
    else {
      uVar6 = 0;
      uVar5 = 0;
      uVar4 = (uint)bVar1;
      do {
        if (((byte)s[uVar6 + 1] & 0xffffffc0) != 0x80) {
          return (char *)0x0;
        }
        uVar5 = (byte)s[uVar6 + 1] & 0x3f | uVar5 << 6;
        uVar3 = uVar4 * 2;
        uVar6 = uVar6 + 1;
        uVar2 = uVar4 & 0x20;
        uVar4 = uVar3;
      } while (uVar2 != 0);
    }
    if (5 < (uint)uVar6) {
      return (char *)0x0;
    }
    uVar5 = (uVar3 & 0x3f) << ((char)uVar6 * '\x05' & 0x1fU) | uVar5;
    if ((int)uVar5 < 0) {
      return (char *)0x0;
    }
    if (uVar5 < utf8_decode::limits[uVar6 & 0xffffffff]) {
      return (char *)0x0;
    }
    s = s + (uVar6 & 0xffffffff);
  }
  if ((strict != 0) && ((uVar5 & 0x1ff800) == 0xd800 || 0x10ffff < uVar5)) {
    return (char *)0x0;
  }
  if (val != (utfint *)0x0) {
    *val = uVar5;
  }
  return s + 1;
}

Assistant:

static const char *utf8_decode (const char *s, utfint *val, int strict) {
  static const utfint limits[] =
        {~(utfint)0, 0x80, 0x800, 0x10000u, 0x200000u, 0x4000000u};
  unsigned int c = (unsigned char)s[0];
  utfint res = 0;  /* final result */
  if (c < 0x80)  /* ascii? */
    res = c;
  else {
    int count = 0;  /* to count number of continuation bytes */
    for (; c & 0x40; c <<= 1) {  /* while it needs continuation bytes... */
      unsigned int cc = (unsigned char)s[++count];  /* read next byte */
      if (!iscont(cc))  /* not a continuation byte? */
        return NULL;  /* invalid byte sequence */
      res = (res << 6) | (cc & 0x3F);  /* add lower 6 bits from cont. byte */
    }
    res |= ((utfint)(c & 0x7F) << (count * 5));  /* add first byte */
    if (count > 5 || res > MAXUTF || res < limits[count])
      return NULL;  /* invalid byte sequence */
    s += count;  /* skip continuation bytes read */
  }
  if (strict) {
    /* check for invalid code points; too large or surrogates */
    if (res > MAXUNICODE || (0xD800u <= res && res <= 0xDFFFu))
      return NULL;
  }
  if (val) *val = res;
  return s + 1;  /* +1 to include first byte */
}